

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

bool __thiscall mkvparser::Tags::Tag::ExpandSimpleTagsArray(Tag *this)

{
  SimpleTag *pSVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  ulong uVar4;
  ulong *puVar5;
  SimpleTag *this_00;
  ulong uVar6;
  SimpleTag *local_a8;
  SimpleTag *local_80;
  int local_74;
  int local_68;
  int idx;
  SimpleTag *displays;
  int size;
  Tag *this_local;
  
  if (this->m_simple_tags_count < this->m_simple_tags_size) {
    this_local._7_1_ = true;
  }
  else {
    if (this->m_simple_tags_size == 0) {
      local_74 = 1;
    }
    else {
      local_74 = this->m_simple_tags_size << 1;
    }
    uVar3 = (ulong)local_74;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar3;
    uVar4 = SUB168(auVar2 * ZEXT816(0x10),0);
    uVar6 = uVar4 + 8;
    if (SUB168(auVar2 * ZEXT816(0x10),8) != 0 || 0xfffffffffffffff7 < uVar4) {
      uVar6 = 0xffffffffffffffff;
    }
    puVar5 = (ulong *)operator_new__(uVar6,(nothrow_t *)&std::nothrow);
    local_80 = (SimpleTag *)0x0;
    if (puVar5 != (ulong *)0x0) {
      *puVar5 = uVar3;
      local_80 = (SimpleTag *)(puVar5 + 1);
      if (uVar3 != 0) {
        local_a8 = local_80;
        do {
          SimpleTag::SimpleTag(local_a8);
          local_a8 = local_a8 + 1;
        } while (local_a8 != local_80 + uVar3);
      }
    }
    if (local_80 == (SimpleTag *)0x0) {
      this_local._7_1_ = false;
    }
    else {
      for (local_68 = 0; local_68 < this->m_simple_tags_count; local_68 = local_68 + 1) {
        SimpleTag::ShallowCopy(this->m_simple_tags + local_68,local_80 + local_68);
      }
      pSVar1 = this->m_simple_tags;
      if (pSVar1 != (SimpleTag *)0x0) {
        this_00 = pSVar1 + (long)pSVar1[-1].m_tag_string;
        while (pSVar1 != this_00) {
          this_00 = this_00 + -1;
          SimpleTag::~SimpleTag(this_00);
        }
        operator_delete__(&pSVar1[-1].m_tag_string);
      }
      this->m_simple_tags = local_80;
      this->m_simple_tags_size = local_74;
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Tags::Tag::ExpandSimpleTagsArray() {
  if (m_simple_tags_size > m_simple_tags_count)
    return true;  // nothing else to do

  const int size = (m_simple_tags_size == 0) ? 1 : 2 * m_simple_tags_size;

  SimpleTag* const displays = new (std::nothrow) SimpleTag[size];

  if (displays == NULL)
    return false;

  for (int idx = 0; idx < m_simple_tags_count; ++idx) {
    m_simple_tags[idx].ShallowCopy(displays[idx]);
  }

  delete[] m_simple_tags;
  m_simple_tags = displays;

  m_simple_tags_size = size;
  return true;
}